

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextFile.cpp
# Opt level: O0

Array<asl::String> __thiscall asl::TextFile::lines(TextFile *this)

{
  bool bVar1;
  uint uVar2;
  String *s;
  int __oflag;
  TextFile *in_RSI;
  String local_48;
  undefined1 local_19;
  TextFile *this_local;
  Array<asl::String> *lines;
  
  local_19 = 0;
  this_local = this;
  Array<asl::String>::Array((Array<asl::String> *)this);
  if (((in_RSI->super_File)._file != (FILE *)0x0) ||
     (uVar2 = open(in_RSI,(char *)0x0,__oflag), (uVar2 & 1) != 0)) {
    while (bVar1 = end(in_RSI), ((bVar1 ^ 0xffU) & 1) != 0) {
      asl::String::String(&local_48);
      Array<asl::String>::operator<<((Array<asl::String> *)this,&local_48);
      asl::String::~String(&local_48);
      s = Array<asl::String>::last((Array<asl::String> *)this);
      readLine(in_RSI,s);
    }
  }
  return (Array<asl::String>)(String *)this;
}

Assistant:

Array<String> TextFile::lines()
{
	Array<String> lines;
	if(!_file && !open(READ))
		return lines;
	while (!end()) {
		lines << String();
		readLine(lines.last());
	}
	return lines;
}